

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferErrors.cpp
# Opt level: O3

void __thiscall glcts::TextureBufferErrors::initTest(TextureBufferErrors *this)

{
  TargetsVector *this_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  uint *puVar4;
  NotSupportedError *this_01;
  iterator iVar5;
  uint local_1c;
  long lVar3;
  
  if ((this->super_TestCaseBase).m_is_texture_buffer_supported != false) {
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lVar3 + 0x6f8))(1,&this->m_tex_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Could not generate texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferErrors.cpp"
                    ,0x60);
    (**(code **)(lVar3 + 0xb8))
              ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tex_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Could not bind texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferErrors.cpp"
                    ,99);
    (**(code **)(lVar3 + 0x6c8))(1,&this->m_bo_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Could not generate buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferErrors.cpp"
                    ,0x66);
    (**(code **)(lVar3 + 0x40))
              ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_bo_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Could not bind buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferErrors.cpp"
                    ,0x69);
    (**(code **)(lVar3 + 0x150))
              ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x1000,0,0x88e5);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Could not allocate buffer object\'s data store",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferErrors.cpp"
                    ,0x6c);
    this_00 = &this->m_texture_targets;
    local_1c = 0xde1;
    iVar5._M_current =
         (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    puVar4 = (this->m_texture_targets).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (iVar5._M_current == puVar4) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar5,&local_1c);
      iVar5._M_current =
           (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      puVar4 = (this->m_texture_targets).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar5._M_current = 0xde1;
      iVar5._M_current = iVar5._M_current + 1;
      (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    local_1c = 0x8c1a;
    if (iVar5._M_current == puVar4) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar5,&local_1c);
      iVar5._M_current =
           (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      puVar4 = (this->m_texture_targets).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar5._M_current = 0x8c1a;
      iVar5._M_current = iVar5._M_current + 1;
      (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    local_1c = 0x806f;
    if (iVar5._M_current == puVar4) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar5,&local_1c);
      iVar5._M_current =
           (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      puVar4 = (this->m_texture_targets).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar5._M_current = 0x806f;
      iVar5._M_current = iVar5._M_current + 1;
      (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current;
    }
    local_1c = 0x8513;
    if (iVar5._M_current == puVar4) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar5,&local_1c);
    }
    else {
      *iVar5._M_current = 0x8513;
      (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
    }
    if ((this->super_TestCaseBase).m_is_texture_cube_map_array_supported == true) {
      local_1c = 0x9009;
      iVar5._M_current =
           (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (this_00,iVar5,&local_1c);
      }
      else {
        *iVar5._M_current = 0x9009;
        (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
    }
    if ((this->super_TestCaseBase).m_is_texture_storage_multisample_supported == true) {
      local_1c = 0x9100;
      iVar5._M_current =
           (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (this_00,iVar5,&local_1c);
      }
      else {
        *iVar5._M_current = 0x9100;
        (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
    }
    if ((this->super_TestCaseBase).m_is_texture_storage_multisample_2d_array_supported == true) {
      local_1c = 0x9102;
      iVar5._M_current =
           (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (this_00,iVar5,&local_1c);
      }
      else {
        *iVar5._M_current = 0x9102;
        (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
    }
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Texture buffer functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferErrors.cpp"
             ,0x59);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBufferErrors::initTest(void)
{
	/* Skip if required extensions are not supported. */
	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genTextures(1, &m_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate texture object!");

	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, m_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind texture object!");

	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate buffer object!");

	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object!");

	gl.bufferData(m_glExtTokens.TEXTURE_BUFFER, m_bo_size, DE_NULL, GL_STATIC_READ);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not allocate buffer object's data store");

	m_texture_targets.push_back(GL_TEXTURE_2D);
	m_texture_targets.push_back(GL_TEXTURE_2D_ARRAY);
	m_texture_targets.push_back(GL_TEXTURE_3D);
	m_texture_targets.push_back(GL_TEXTURE_CUBE_MAP);

	if (m_is_texture_cube_map_array_supported)
	{
		m_texture_targets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);
	}

	if (m_is_texture_storage_multisample_supported)
	{
		m_texture_targets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
	}

	if (m_is_texture_storage_multisample_2d_array_supported)
	{
		m_texture_targets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES);
	}
}